

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O0

void __thiscall Transform::Transform(Transform *this,Matrix4f *m,Object3D *obj)

{
  Object3D *obj_local;
  Matrix4f *m_local;
  Transform *this_local;
  
  Object3D::Object3D(&this->super_Object3D);
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Transform_00170b08;
  this->_object = obj;
  Matrix4f::Matrix4f(&this->_m,m);
  Matrix4f::inverse(&this->_m_inverse,m,(bool *)0x0,0.0);
  return;
}

Assistant:

Transform(const Matrix4f &m, Object3D *obj) : _object(obj), _m(m), _m_inverse(m.inverse()) {}